

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

string * __thiscall
pbrt::InstanceSceneEntity::ToString_abi_cxx11_
          (string *__return_storage_ptr__,InstanceSceneEntity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  allocator<char> local_39;
  
  if (this->renderFromInstance == (Transform *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffc8,"nullptr",&local_39);
  }
  else {
    Transform::ToString_abi_cxx11_((string *)&stack0xffffffffffffffc8,this->renderFromInstance);
  }
  StringPrintf<std::__cxx11::string_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string>
            (__return_storage_ptr__,
             (pbrt *)
             "[ InstanceSeneEntity name: %s loc: %s renderFromInstanceAnim: %s renderFromInstance: %s ]"
             ,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_SceneEntity).loc,(FileLoc *)&this->renderFromInstanceAnim,
             (AnimatedTransform *)&stack0xffffffffffffffc8,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf(
            "[ InstanceSeneEntity name: %s loc: %s "
            "renderFromInstanceAnim: %s renderFromInstance: %s ]",
            name, loc, renderFromInstanceAnim,
            renderFromInstance ? renderFromInstance->ToString() : std::string("nullptr"));
    }